

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O1

void __thiscall itis::SplayTree::Clear(SplayTree *this,Node *x)

{
  Node *pNVar1;
  Node *x_00;
  
LAB_00104111:
  do {
    pNVar1 = x;
    if (pNVar1 == (Node *)0x0) {
      return;
    }
    x = pNVar1->left_child;
    if (x == (Node *)0x0) {
      if (pNVar1->right_child == (Node *)0x0) goto LAB_0010414b;
    }
    else {
      x_00 = x;
      if (pNVar1->right_child == (Node *)0x0) goto LAB_00104146;
      if (x != (Node *)0x0) goto LAB_00104111;
    }
    x_00 = pNVar1->right_child;
    if (x_00 != (Node *)0x0) {
LAB_00104146:
      Clear(this,x_00);
LAB_0010414b:
      operator_delete(pNVar1,0x20);
      return;
    }
  } while( true );
}

Assistant:

void SplayTree::Clear(Node *x) {
    if (x != nullptr) {
      if (x->left_child != nullptr || x->right_child != nullptr) {
        if (x->left_child != nullptr && x->right_child == nullptr) {
          Clear(x->left_child);
          delete x;
        } else if (x->left_child == nullptr && x->right_child != nullptr) {
          Clear(x->right_child);
          delete x;
        } else {
          Clear(x->left_child);
        }
      } else {
        delete x;
      }
    }
  }